

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_R_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Data_R_PDU::GetAsString_abi_cxx11_(Data_R_PDU *this)

{
  long in_RSI;
  
  GetAsString_abi_cxx11_((KString *)this,(Data_R_PDU *)(in_RSI + -0x88));
  return;
}

Assistant:

KString Data_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Data PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "\tRequest ID:                "   << m_ui32RequestID
       << Reliability_Header::GetAsString()
       << "\n\tNumber Fixed Datum:        " << m_ui32NumFixedDatum
       << "\n\tNumber Variable Datum:     " << m_ui32NumVariableDatum
       << "\n";

    ss << "Fixed Datumn";
    vector<FixDtmPtr>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<FixDtmPtr>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        ss << IndentString( ( *citrFixed )->GetAsString() );
    }

    ss << "Variable Datumn";
    vector<VarDtmPtr>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<VarDtmPtr>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        ss << IndentString( ( *citrVar )->GetAsString() );
    }

    return ss.str();
}